

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.cpp
# Opt level: O0

Color * __thiscall
RayTracer::m_calcRefraction
          (Color *__return_storage_ptr__,RayTracer *this,Collision *coll,Material *material,
          double weight,int depth)

{
  double dVar1;
  double __x;
  Color local_b0;
  Color local_98;
  Color local_80;
  undefined1 local_68 [8];
  Color ret;
  Vector3 r;
  double rindex;
  int depth_local;
  double weight_local;
  Material *material_local;
  Collision *coll_local;
  RayTracer *this_local;
  
  r.z = material->rindex;
  if ((coll->is_internal != 0.0) || (NAN(coll->is_internal))) {
    r.z = 1.0 / r.z;
  }
  Vector3::refract((Vector3 *)&ret.b,&coll->ray_dir,&coll->n,r.z);
  dVar1 = Vector3::mod2((Vector3 *)&ret.b);
  if (1e-06 <= dVar1) {
    m_rayTraceing((Color *)local_68,this,&coll->p,(Vector3 *)&ret.b,weight * material->refr,
                  depth + 1);
    if ((coll->is_internal != 0.0) || (NAN(coll->is_internal))) {
      Color::operator*(&local_b0,&material->absorb_color,-coll->dist);
      Color::exp(&local_98,__x);
      operator*(&local_80,(Color *)local_68,&local_98);
      Color::operator*(__return_storage_ptr__,&local_80,material->refr);
    }
    else {
      Color::operator*(__return_storage_ptr__,(Color *)local_68,material->refr);
    }
  }
  else {
    Color::Color(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Color RayTracer::m_calcRefraction(const Collision& coll, const Material* material, double weight, int depth) const
{
    double rindex = material->rindex;
    if (coll.is_internal) rindex = 1 / rindex;
    Vector3 r = coll.ray_dir.refract(coll.n, rindex);
    if (r.mod2() < Const::EPS) return Color();

    Color ret = m_rayTraceing(coll.p, r, weight * material->refr, depth + 1);
    if (!coll.is_internal)
        return ret * material->refr;
    else
        return ret * (material->absorb_color * -coll.dist).exp() * material->refr;
}